

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O0

Vec_Int_t * Cnf_ManWriteCnfMapping(Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  int iVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj_00;
  Cnf_Cut_t *pCut_00;
  uint *puVar2;
  int local_3c;
  int local_38;
  int nOffset;
  int k;
  int i;
  Cnf_Cut_t *pCut;
  Aig_Obj_t *pObj;
  Vec_Int_t *vResult;
  Vec_Ptr_t *vMapped_local;
  Cnf_Man_t *p_local;
  
  local_3c = Aig_ManObjNumMax(p->pManAig);
  p_00 = Vec_IntStart(local_3c);
  nOffset = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vMapped);
    if (iVar1 <= nOffset) {
      return p_00;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vMapped,nOffset);
    iVar1 = Aig_ObjIsNode(pObj_00);
    if (iVar1 == 0) break;
    pCut_00 = Cnf_ObjBestCut(pObj_00);
    if ('\x04' < pCut_00->nFanins) {
      __assert_fail("pCut->nFanins < 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                    ,0x39,"Vec_Int_t *Cnf_ManWriteCnfMapping(Cnf_Man_t *, Vec_Ptr_t *)");
    }
    iVar1 = Aig_ObjId(pObj_00);
    Vec_IntWriteEntry(p_00,iVar1,local_3c);
    puVar2 = Cnf_CutTruth(pCut_00);
    Vec_IntPush(p_00,*puVar2);
    for (local_38 = 0; local_38 < pCut_00->nFanins; local_38 = local_38 + 1) {
      Vec_IntPush(p_00,*(int *)((long)pCut_00[1].vIsop + (long)local_38 * 4 + -8));
    }
    for (; local_38 < 4; local_38 = local_38 + 1) {
      Vec_IntPush(p_00,-1);
    }
    local_3c = local_3c + 5;
    nOffset = nOffset + 1;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                ,0x37,"Vec_Int_t *Cnf_ManWriteCnfMapping(Cnf_Man_t *, Vec_Ptr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives CNF mapping.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Cnf_ManWriteCnfMapping( Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Vec_Int_t * vResult;
    Aig_Obj_t * pObj;
    Cnf_Cut_t * pCut;
    int i, k, nOffset;
    nOffset = Aig_ManObjNumMax(p->pManAig);
    vResult = Vec_IntStart( nOffset );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );
        assert( pCut->nFanins < 5 );
        Vec_IntWriteEntry( vResult, Aig_ObjId(pObj), nOffset );
        Vec_IntPush( vResult, *Cnf_CutTruth(pCut) );
        for ( k = 0; k < pCut->nFanins; k++ )
            Vec_IntPush( vResult, pCut->pFanins[k] );
        for (      ; k < 4; k++ )
            Vec_IntPush( vResult, -1 );
        nOffset += 5;
    }
    return vResult;
}